

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::HlslParseContext::remapNonEntryPointIO(HlslParseContext *this,TFunction *function)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TQualifier *pTVar3;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  uint local_1c;
  int i;
  TFunction *function_local;
  HlslParseContext *this_local;
  
  iVar2 = (*(function->super_TSymbol)._vptr_TSymbol[0xc])();
  iVar2 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x38))();
  if (iVar2 != 0) {
    iVar2 = (*(function->super_TSymbol)._vptr_TSymbol[0xd])();
    pTVar3 = (TQualifier *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x50))();
    clearUniformInputOutput(this,pTVar3);
  }
  local_1c = 0;
  while( true ) {
    iVar2 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])();
    if (iVar2 <= (int)local_1c) break;
    iVar2 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])(function,(ulong)local_1c);
    bVar1 = isReference(this,*(TType **)(CONCAT44(extraout_var_01,iVar2) + 8));
    if (!bVar1) {
      iVar2 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])(function,(ulong)local_1c);
      pTVar3 = (TQualifier *)
               (**(code **)(**(long **)(CONCAT44(extraout_var_02,iVar2) + 8) + 0x50))();
      clearUniformInputOutput(this,pTVar3);
    }
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void HlslParseContext::remapNonEntryPointIO(TFunction& function)
{
    // return value
    if (function.getType().getBasicType() != EbtVoid)
        clearUniformInputOutput(function.getWritableType().getQualifier());

    // parameters.
    // References to structuredbuffer types are left unmodified
    for (int i = 0; i < function.getParamCount(); i++)
        if (!isReference(*function[i].type))
            clearUniformInputOutput(function[i].type->getQualifier());
}